

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::connect
          (ConcurrencyLimitingHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  HttpClient *pHVar1;
  SourceLocation location;
  SourceLocation location_00;
  ConnectRequest *request;
  ConnectionCounter *counter_00;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  *__x;
  TypeByIndex<0UL,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>
  *t;
  Promise<kj::HttpClient::ConnectRequest::Status> *pPVar2;
  TypeByIndex<1UL,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>
  *t_00;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *pPVar3;
  uint __flags;
  undefined4 in_register_0000000c;
  StringPtr *params;
  void *__child_stack;
  undefined4 in_register_00000034;
  ConcurrencyLimitingHttpClient *this_00;
  __fn *in_R8;
  void *__arg;
  HttpConnectSettings *in_R9;
  undefined8 in_stack_fffffffffffffde0;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> local_190 [2];
  SourceLocation local_180;
  ConcurrencyLimitingHttpClient *local_168;
  String local_160;
  HttpHeaders local_148;
  HttpConnectSettings local_e8;
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> local_d8;
  undefined1 local_d0 [8];
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  SourceLocation local_b8;
  undefined1 local_a0 [8];
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  ConcurrencyLimitingHttpClient *local_68;
  Header *pHStack_60;
  undefined1 local_58 [8];
  ConnectRequest response;
  ConnectionCounter counter;
  HttpConnectSettings *settings_local;
  HttpHeaders *headers_local;
  ConcurrencyLimitingHttpClient *this_local;
  StringPtr host_local;
  
  this_00 = (ConcurrencyLimitingHttpClient *)CONCAT44(in_register_00000034,__fd);
  host_local.content.ptr = (char *)CONCAT44(in_register_0000000c,__len);
  this_local = (ConcurrencyLimitingHttpClient *)__addr;
  host_local.content.size_ = (size_t)this;
  if (this_00->concurrentRequests < this_00->maxConcurrentRequests) {
    ConnectionCounter::ConnectionCounter((ConnectionCounter *)&response.connection.ptr,this_00);
    pHVar1 = this_00->inner;
    local_68 = this_local;
    pHStack_60 = (Header *)host_local.content.ptr;
    HttpConnectSettings::HttpConnectSettings((HttpConnectSettings *)&stack0xffffffffffffff88,in_R9);
    (*pHVar1->_vptr_HttpClient[2])
              (local_58,pHVar1,local_68,pHStack_60,in_R8,&stack0xffffffffffffff88);
    fireCountChanged(this_00);
    request = mv<kj::HttpClient::ConnectRequest>((ConnectRequest *)local_58);
    counter_00 = mv<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                           ((ConnectionCounter *)&response.connection.ptr);
    attachCounter((ConnectRequest *)this,request,counter_00);
    HttpClient::ConnectRequest::~ConnectRequest((ConnectRequest *)local_58);
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&response.connection.ptr);
  }
  else {
    __arg = (void *)0x10;
    SourceLocation::SourceLocation
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"connect",0x199d);
    location_00.function = (char *)local_b8._16_8_;
    location_00.fileName = local_b8.function;
    location_00.lineNumber = (int)in_stack_fffffffffffffde0;
    location_00.columnNumber = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              (location_00);
    __flags = local_b8.lineNumber;
    local_168 = this_00;
    str<kj::StringPtr&>(&local_160,(kj *)&this_local,params);
    HttpHeaders::clone(&local_148,in_R8,__child_stack,__flags,__arg);
    HttpConnectSettings::HttpConnectSettings(&local_e8,in_R9);
    Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::
    then<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_>
              (&local_d8,(Type *)local_a0);
    SourceLocation::SourceLocation
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"connect",0x199f,0x12);
    location.function = local_180.function;
    location.fileName = local_180.fileName;
    location.lineNumber = local_180.lineNumber;
    location.columnNumber = local_180.columnNumber;
    Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
    ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
             *)local_d0,location);
    Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
    ::~Promise((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
                *)&local_d8);
    (anonymous_namespace)::ConcurrencyLimitingHttpClient::
    connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::
    {lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1}::
    ~ConnectionCounter((_lambda_kj___anonymous_namespace___ConcurrencyLimitingHttpClient__ConnectionCounter____1_
                        *)&local_168);
    __x = mv<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>>
                    ((Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
                      *)&paf);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>_>
    ::push(&this_00->pendingRequests,__x);
    fireCountChanged(this_00);
    t = get<0ul,kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>&>
                  ((Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
                    *)local_d0);
    pPVar2 = mv<kj::Promise<kj::HttpClient::ConnectRequest::Status>>(t);
    Promise<kj::HttpClient::ConnectRequest::Status>::Promise
              ((Promise<kj::HttpClient::ConnectRequest::Status> *)this,pPVar2);
    t_00 = get<1ul,kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>&>
                     ((Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
                       *)local_d0);
    pPVar3 = mv<kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>(t_00);
    Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::Promise(local_190,pPVar3);
    newPromisedStream((kj *)&this->inner,local_190);
    Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise(local_190);
    kj::_::
    Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
    ::~Tuple((Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
              *)local_d0);
    PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
    ::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)local_a0);
  }
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const kj::HttpHeaders& headers, HttpConnectSettings settings) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto response = inner.connect(host, headers, settings);
      fireCountChanged();
      return attachCounter(kj::mv(response), kj::mv(counter));
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();

    auto split = paf.promise
        .then([this, host=kj::str(host), headers=headers.clone(), settings]
              (ConnectionCounter&& counter) mutable
                  -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                               kj::Promise<kj::Own<kj::AsyncIoStream>>> {
      auto request = attachCounter(inner.connect(host, headers, settings), kj::mv(counter));
      return kj::tuple(kj::mv(request.status), kj::mv(request.connection));
    }).split();

    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();

    return ConnectRequest {
      kj::mv(kj::get<0>(split)),
      kj::newPromisedStream(kj::mv(kj::get<1>(split)))
    };
  }